

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::rollDiceSequence(Dice *this)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  bool bVar3;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_48;
  int local_14;
  Dice *pDStack_10;
  int count;
  Dice *this_local;
  
  pDStack_10 = this;
  resetDiceRolls(this);
  poVar2 = std::operator<<((ostream *)&std::cout,"Rolling first hand of dice for player");
  iVar1 = getPlayerNumber(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Press enter to continue");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::istream::ignore();
  rollDice(this,6);
  this->numberOfRolls = this->numberOfRolls + -1;
  while( true ) {
    iVar1 = getNumbOfRollsRemaining(this);
    bVar3 = true;
    if (iVar1 != 1) {
      iVar1 = getNumbOfRollsRemaining(this);
      bVar3 = iVar1 == 2;
    }
    if (!bVar3) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Sequence number ");
    iVar1 = getNumbOfRollsRemaining(this);
    this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_14 = 0;
    local_14 = addToCount(this);
    poVar2 = std::operator<<((ostream *)&std::cout,"Rolling ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,6 - local_14);
    poVar2 = std::operator<<(poVar2," dice since you saved: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    std::operator<<(poVar2,"\n");
    rollDice(this,6 - local_14);
    this->numberOfRolls = this->numberOfRolls + -1;
  }
  iVar1 = getNumbOfRollsRemaining(this);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n No hands left: Resolving ......");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
    ::map(&local_48,&this->resolvedHand);
    storeResolvedHand(this,&local_48);
    std::
    map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
    ::~map(&local_48);
    resetResolvedHand(this);
    resetDiceValuesMap(this);
    std::
    vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
    ::clear(&this->historyOfRolls);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Resolved Final Values ---------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    diceHistoricalResolvedValues(this);
  }
  return;
}

Assistant:

void Dice::rollDiceSequence() {
    resetDiceRolls();

    cout << "Rolling first hand of dice for player" << this->getPlayerNumber() << "\n";
    cout << "Press enter to continue" << endl;
    cin.ignore();
    this->rollDice(6);
    numberOfRolls--;

    while (getNumbOfRollsRemaining() == 1 || getNumbOfRollsRemaining() == 2) {         // roll 2
        cout << "Sequence number " << getNumbOfRollsRemaining() << endl;
        int count =0;
        count = addToCount();
        cout << "Rolling " << (6-count) << " dice since you saved: " << count << "\n";

        this->rollDice(6-count);
        numberOfRolls--;
    }

    if (getNumbOfRollsRemaining() == 0) {
        cout << "\n No hands left: Resolving ......" << endl;
        storeResolvedHand(resolvedHand);
        resetResolvedHand();
        resetDiceValuesMap();
        historyOfRolls.clear();

        cout << "Resolved Final Values ---------------------------" << endl;
        this->diceHistoricalResolvedValues();
    }


}